

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

bool __thiscall ON_NurbsCage::ReserveCVCapacity(ON_NurbsCage *this,int capacity)

{
  double *pdVar1;
  int local_28;
  int local_24;
  int capacity_local;
  ON_NurbsCage *this_local;
  
  if ((0 < capacity) && (this->m_cv_capacity < capacity)) {
    if (this->m_cv == (double *)0x0) {
      pdVar1 = (double *)onmalloc((long)capacity << 3);
      this->m_cv = pdVar1;
      local_28 = capacity;
      if (this->m_cv == (double *)0x0) {
        local_28 = 0;
      }
      this->m_cv_capacity = local_28;
    }
    else if (this->m_cv_capacity != 0) {
      pdVar1 = (double *)onrealloc(this->m_cv,(long)capacity << 3);
      this->m_cv = pdVar1;
      local_24 = capacity;
      if (this->m_cv == (double *)0x0) {
        local_24 = 0;
      }
      this->m_cv_capacity = local_24;
    }
  }
  return (bool)(-(this->m_cv != (double *)0x0) & 1);
}

Assistant:

bool ON_NurbsCage::ReserveCVCapacity(
  int capacity// number of doubles to reserve
  )
{
  if ( capacity > 0 && m_cv_capacity < capacity ) 
  {
    if ( m_cv ) 
    {
      if ( m_cv_capacity ) 
      {
        m_cv = (double*)onrealloc( m_cv, capacity*sizeof(*m_cv) );
        m_cv_capacity = (m_cv) ? capacity : 0;
      }
      // else user supplied m_cv[] array
    }
    else 
    {
      m_cv = (double*)onmalloc( capacity*sizeof(*m_cv) );
      m_cv_capacity = (m_cv) ? capacity : 0;
    }
  }
  return ( m_cv ) ? true : false;
}